

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityType.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::EntityType::ReadFromTokenisedString
          (EntityType *this,KString *String,KString *Seperator)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  char *__nptr;
  KException *this_00;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  allocator<char> local_89;
  vector<unsigned_short,_std::allocator<unsigned_short>_> vValues;
  KString local_70;
  KString sCopy;
  
  std::__cxx11::string::string((string *)&sCopy,(string *)String);
  vValues.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vValues.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vValues.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  while( true ) {
    __nptr = strtok(sCopy._M_dataplus._M_p,(Seperator->_M_dataplus)._M_p);
    if (__nptr == (char *)0x0) break;
    iVar4 = atoi(__nptr);
    local_70._M_dataplus._M_p._0_2_ = (undefined2)iVar4;
    if (iVar4 < 1) {
      local_70._M_dataplus._M_p._0_2_ = 0;
    }
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
              (&vValues,(unsigned_short *)&local_70);
    sCopy._M_dataplus._M_p = (char *)0x0;
  }
  if ((long)vValues.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)vValues.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start == 0xe) {
    this->m_ui8EntityKind =
         (KUINT8)*vValues.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    this->m_ui8Domain =
         (KUINT8)vValues.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                 .super__Vector_impl_data._M_start[1];
    this->m_ui16Country =
         vValues.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
         super__Vector_impl_data._M_start[2];
    uVar1 = vValues.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start[4];
    uVar2 = vValues.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start[5];
    uVar3 = vValues.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start[6];
    uVar5 = vValues.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start[3] & 0xff;
    uVar6 = uVar1 & 0xff;
    uVar7 = uVar2 & 0xff;
    uVar8 = uVar3 & 0xff;
    this->m_ui8Category =
         (uVar5 != 0) * (uVar5 < 0x100) *
         (char)vValues.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_start[3] - (0xff < uVar5);
    this->m_ui8SubCategory = (uVar6 != 0) * (uVar6 < 0x100) * (char)uVar1 - (0xff < uVar6);
    this->m_ui8Specific = (uVar7 != 0) * (uVar7 < 0x100) * (char)uVar2 - (0xff < uVar7);
    this->m_ui8Extra = (uVar8 != 0) * (uVar8 < 0x100) * (char)uVar3 - (0xff < uVar8);
    std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
              (&vValues.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
    std::__cxx11::string::~string((string *)&sCopy);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"ReadFromTokenisedString",&local_89);
  KException::KException<char_const*>
            (this_00,&local_70,8,"Token String Must Contain 7 Integer Values Only.");
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void EntityType::ReadFromTokenisedString(const KString &String, const KString &Seperator /*= ","*/ ) noexcept(false)
{
    // Copy the string, we don't want to change the string we have been passed.
    KString sCopy = String;

    vector<KUINT16> vValues;

    KCHAR8 * token = strtok( ( KCHAR8 * )sCopy.c_str(), Seperator.c_str() );

    while (token != nullptr)
    {
        auto i = atoi(token);
        if( i < 0 ) i = 0; // If the value is less than 0 then we need to make it 0.

        vValues.push_back(static_cast<unsigned short>(i));

        // Get next token:
        token = strtok(nullptr, Seperator.c_str());
    }

    // We need 7 values in total, if not we have a problem.
    if( vValues.size() != 7 )
    {
        throw KException( __FUNCTION__, INVALID_DATA, "Token String Must Contain 7 Integer Values Only." );
    }

    // Set the new type.
    m_ui8EntityKind = vValues[0];
    m_ui8Domain = vValues[1];
    m_ui16Country = vValues[2];
    m_ui8Category = vValues[3];
    m_ui8SubCategory = vValues[4];
    m_ui8Specific = vValues[5];
    m_ui8Extra = vValues[6];
}